

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_prepare_transfer(Curl_easy *data)

{
  connectdata *conn_00;
  undefined8 uVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *fmt;
  connectdata *conn;
  
  conn_00 = data->conn;
  if (((data->req).p.file)->fd != 0) {
    (conn_00->proto).ftpc.state = '\r';
    CVar2 = ftp_state_quote(data,true,'\r');
    return CVar2;
  }
  uVar1 = *(undefined8 *)&(data->set).field_0x8ba;
  if (((uint)uVar1 >> 0xc & 1) == 0) {
    if (-1 < (short)uVar1) {
      CVar2 = ftp_state_use_pasv(data,conn_00);
      return CVar2;
    }
    pcVar3 = (conn_00->proto).ftpc.file;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (data->set).str[6];
      if ((pcVar3 == (char *)0x0) && (pcVar3 = "NLST", ((data->state).field_0x74d & 0x80) == 0)) {
        pcVar3 = "LIST";
      }
      fmt = "PRET %s";
    }
    else if (((data->state).field_0x74e & 0x10) == 0) {
      fmt = "PRET RETR %s";
    }
    else {
      fmt = "PRET STOR %s";
    }
    CVar2 = Curl_pp_sendf(data,&(conn_00->proto).ftpc.pp,fmt,pcVar3);
    if (CVar2 == CURLE_OK) {
      (data->conn->proto).ftpc.state = '\x1d';
    }
    return CVar2;
  }
  CVar2 = ftp_state_use_port(data,EPRT);
  return CVar2;
}

Assistant:

static CURLcode ftp_state_prepare_transfer(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if(ftp->transfer != PPTRANSFER_BODY) {
    /* doesn't transfer any data */

    /* still possibly do PRE QUOTE jobs */
    ftp_state(data, FTP_RETR_PREQUOTE);
    result = ftp_state_quote(data, TRUE, FTP_RETR_PREQUOTE);
  }
  else if(data->set.ftp_use_port) {
    /* We have chosen to use the PORT (or similar) command */
    result = ftp_state_use_port(data, EPRT);
  }
  else {
    /* We have chosen (this is default) to use the PASV (or similar) command */
    if(data->set.ftp_use_pret) {
      /* The user has requested that we send a PRET command
         to prepare the server for the upcoming PASV */
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      if(!conn->proto.ftpc.file)
        result = Curl_pp_sendf(data, &ftpc->pp, "PRET %s",
                               data->set.str[STRING_CUSTOMREQUEST]?
                               data->set.str[STRING_CUSTOMREQUEST]:
                               (data->state.list_only?"NLST":"LIST"));
      else if(data->state.upload)
        result = Curl_pp_sendf(data, &ftpc->pp, "PRET STOR %s",
                               conn->proto.ftpc.file);
      else
        result = Curl_pp_sendf(data, &ftpc->pp, "PRET RETR %s",
                               conn->proto.ftpc.file);
      if(!result)
        ftp_state(data, FTP_PRET);
    }
    else
      result = ftp_state_use_pasv(data, conn);
  }
  return result;
}